

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcoflow.c
# Opt level: O2

DLword gc_handleoverflow(DLword arg)

{
  DLword *pDVar1;
  ushort uVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  uint uVar5;
  LispPTR *pLVar6;
  
  pLVar6 = HToverflow;
  while( true ) {
    pDVar3 = DTDspace;
    uVar5 = *pLVar6 & 0xfffffff;
    if (uVar5 == 0) break;
    if ((-1 < *(short *)((ulong)(uVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar5,*pLVar6 >> 0x1c);
    }
    *pLVar6 = 0;
    pLVar6 = pLVar6 + 1;
  }
  uVar2 = DTDspace[0x5d];
  if (0x400 < uVar2) {
    uVar5 = *Reclaim_cnt_word;
    if (uVar5 != 0) {
      LVar4 = uVar5 - uVar2;
      if (uVar5 < uVar2 || LVar4 == 0) {
        *Reclaim_cnt_word = 0;
        doreclaim();
      }
      else {
        *Reclaim_cnt_word = LVar4;
      }
    }
    pDVar1 = pDVar3 + 0x66;
    *(uint *)pDVar1 = *(int *)pDVar1 + (uint)uVar2;
    pDVar3[0x5d] = 0;
  }
  return arg;
}

Assistant:

DLword gc_handleoverflow(DLword arg) {
  struct htoverflow *cell;
  struct dtd *ptr;
  LispPTR cellcnt;
  LispPTR addr;
  cell = (struct htoverflow *)HToverflow;
  /* This proc. protected from interrupt */
  while ((addr = cell->ptr) != NIL) {
    REC_GCLOOKUP(addr, cell->pcase);
    cell->ptr = 0;
    cell->pcase = 0;
    ++cell; /* (\ADDBASE CELL WORDSPERCELL) */
  }
  ptr = (struct dtd *)GetDTD(TYPE_LISTP);
  /* same as "extern struct dtd *ListpDTD" */
  if ((cellcnt = ptr->dtd_cnt0) > 1024) {
    Increment_Allocation_Count(cellcnt);
    ptr->dtd_oldcnt += cellcnt;
    ptr->dtd_cnt0 = 0;
  }
  return (arg);
}